

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

void __thiscall
QMetaObjectBuilder::addMetaObject
          (QMetaObjectBuilder *this,QMetaObject *prototype,AddMembers members)

{
  StaticMetacallFunction p_Var1;
  uint index;
  int iVar2;
  MethodType MVar3;
  int iVar4;
  char *pcVar5;
  QMetaObject *pQVar6;
  int __type;
  int __type_00;
  int __type_01;
  QList<const_QMetaObject_*> *this_00;
  SuperData *pSVar7;
  long in_FS_OFFSET;
  char local_88;
  QByteArray local_80;
  QMetaClassInfo local_68;
  QMetaProperty local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
             super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 1) != 0) {
    pcVar5 = QMetaObject::className(prototype);
    QByteArray::operator=(&this->d->className,pcVar5);
  }
  if (((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
             super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 2) != 0) {
    this->d->superClass = (prototype->d).superdata.direct;
  }
  if (((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
             super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 0x1c) != 0) {
    index = QMetaObject::methodOffset(prototype);
    iVar2 = QMetaObject::methodCount(prototype);
    if ((int)index < iVar2) {
      do {
        local_58.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
        pcVar5 = (char *)(ulong)index;
        local_58._0_16_ = QMetaObject::method(prototype,index);
        MVar3 = QMetaMethod::methodType((QMetaMethod *)&local_58);
        if (MVar3 == Signal) {
LAB_0028b256:
          MVar3 = QMetaMethod::methodType((QMetaMethod *)&local_58);
          if ((((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                      super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 4) == 0) ||
             (MVar3 != Method)) {
            MVar3 = QMetaMethod::methodType((QMetaMethod *)&local_58);
            if ((((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                        super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 8) == 0) ||
               (MVar3 != Signal)) {
              MVar3 = QMetaMethod::methodType((QMetaMethod *)&local_58);
              if ((((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                          super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 0x10) == 0) ||
                 (MVar3 != Slot)) goto LAB_0028b2c8;
            }
          }
          addMethod(this,(QMetaMethod *)&local_58);
        }
        else {
          iVar2 = QMetaMethod::access((QMetaMethod *)&local_58,pcVar5,__type);
          if (iVar2 != 2 ||
              ((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                     super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 0x800) != 0) {
            iVar2 = QMetaMethod::access((QMetaMethod *)&local_58,pcVar5,__type_00);
            if (iVar2 != 0 ||
                ((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                       super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 0x2000) != 0) {
              iVar2 = QMetaMethod::access((QMetaMethod *)&local_58,pcVar5,__type_01);
              if (iVar2 != 1 ||
                  ((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                         super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 0x1000) != 0)
              goto LAB_0028b256;
            }
          }
        }
LAB_0028b2c8:
        index = index + 1;
        iVar2 = QMetaObject::methodCount(prototype);
      } while ((int)index < iVar2);
    }
  }
  if (((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
             super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 0x20) != 0) {
    iVar2 = QMetaObject::constructorCount(prototype);
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        local_58._0_16_ = QMetaObject::constructor(prototype,iVar2);
        addConstructor(this,(QMetaMethod *)&local_58);
        iVar2 = iVar2 + 1;
        iVar4 = QMetaObject::constructorCount(prototype);
      } while (iVar2 < iVar4);
    }
  }
  if (((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
             super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 0x40) != 0) {
    iVar2 = QMetaObject::propertyOffset(prototype);
    iVar4 = QMetaObject::propertyCount(prototype);
    if (iVar2 < iVar4) {
      do {
        QMetaObject::property(&local_58,prototype,iVar2);
        addProperty(this,&local_58);
        iVar2 = iVar2 + 1;
        iVar4 = QMetaObject::propertyCount(prototype);
      } while (iVar2 < iVar4);
    }
  }
  local_88 = (char)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                   super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i;
  if (local_88 < '\0') {
    iVar2 = QMetaObject::enumeratorOffset(prototype);
    iVar4 = QMetaObject::enumeratorCount(prototype);
    if (iVar2 < iVar4) {
      do {
        local_58._0_16_ = QMetaObject::enumerator(prototype,iVar2);
        addEnumerator(this,(QMetaEnum *)&local_58);
        iVar2 = iVar2 + 1;
        iVar4 = QMetaObject::enumeratorCount(prototype);
      } while (iVar2 < iVar4);
    }
  }
  if (((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
             super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i >> 8 & 1) != 0) {
    iVar2 = QMetaObject::classInfoOffset(prototype);
    iVar4 = QMetaObject::classInfoCount(prototype);
    if (iVar2 < iVar4) {
      do {
        local_68.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
        local_68 = QMetaObject::classInfo(prototype,iVar2);
        pcVar5 = QMetaClassInfo::name(&local_68);
        QByteArray::QByteArray((QByteArray *)&local_58,pcVar5,-1);
        pcVar5 = QMetaClassInfo::value(&local_68);
        QByteArray::QByteArray(&local_80,pcVar5,-1);
        addClassInfo(this,(QByteArray *)&local_58,&local_80);
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,1,0x10);
          }
        }
        if ((QArrayData *)local_58.mobj != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_58.mobj)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_58.mobj)->d)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_58.mobj)->d)->_q_value).super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate((QArrayData *)local_58.mobj,1,0x10);
          }
        }
        iVar2 = iVar2 + 1;
        iVar4 = QMetaObject::classInfoCount(prototype);
      } while (iVar2 < iVar4);
    }
  }
  if (((((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
               super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i >> 9 & 1) != 0) &&
      (pSVar7 = (prototype->d).relatedMetaObjects, pSVar7 != (SuperData *)0x0)) &&
     (pQVar6 = pSVar7->direct, pQVar6 != (QMetaObject *)0x0)) {
    do {
      pSVar7 = pSVar7 + 1;
      this_00 = &this->d->relatedMetaObjects;
      local_58.mobj = pQVar6;
      QtPrivate::QPodArrayOps<QMetaObject_const*>::emplace<QMetaObject_const*&>
                ((QPodArrayOps<QMetaObject_const*> *)this_00,(this->d->relatedMetaObjects).d.size,
                 &local_58.mobj);
      QList<const_QMetaObject_*>::end(this_00);
      pQVar6 = pSVar7->direct;
    } while (pQVar6 != (QMetaObject *)0x0);
  }
  if ((((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
              super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i >> 10 & 1) != 0) &&
     (p_Var1 = (prototype->d).static_metacall, p_Var1 != (StaticMetacallFunction)0x0)) {
    this->d->staticMetacallFunction = p_Var1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMetaObjectBuilder::addMetaObject(const QMetaObject *prototype,
                                       QMetaObjectBuilder::AddMembers members)
{
    Q_ASSERT(prototype);
    int index;

    if ((members & ClassName) != 0)
        d->className = prototype->className();

    if ((members & SuperClass) != 0)
        d->superClass = prototype->superClass();

    if ((members & (Methods | Signals | Slots)) != 0) {
        for (index = prototype->methodOffset(); index < prototype->methodCount(); ++index) {
            QMetaMethod method = prototype->method(index);
            if (method.methodType() != QMetaMethod::Signal) {
                if (method.access() == QMetaMethod::Public && (members & PublicMethods) == 0)
                    continue;
                if (method.access() == QMetaMethod::Private && (members & PrivateMethods) == 0)
                    continue;
                if (method.access() == QMetaMethod::Protected && (members & ProtectedMethods) == 0)
                    continue;
            }
            if (method.methodType() == QMetaMethod::Method && (members & Methods) != 0) {
                addMethod(method);
            } else if (method.methodType() == QMetaMethod::Signal &&
                       (members & Signals) != 0) {
                addMethod(method);
            } else if (method.methodType() == QMetaMethod::Slot &&
                       (members & Slots) != 0) {
                addMethod(method);
            }
        }
    }

    if ((members & Constructors) != 0) {
        for (index = 0; index < prototype->constructorCount(); ++index)
            addConstructor(prototype->constructor(index));
    }

    if ((members & Properties) != 0) {
        for (index = prototype->propertyOffset(); index < prototype->propertyCount(); ++index)
            addProperty(prototype->property(index));
    }

    if ((members & Enumerators) != 0) {
        for (index = prototype->enumeratorOffset(); index < prototype->enumeratorCount(); ++index)
            addEnumerator(prototype->enumerator(index));
    }

    if ((members & ClassInfos) != 0) {
        for (index = prototype->classInfoOffset(); index < prototype->classInfoCount(); ++index) {
            QMetaClassInfo ci = prototype->classInfo(index);
            addClassInfo(ci.name(), ci.value());
        }
    }

    if ((members & RelatedMetaObjects) != 0) {
        Q_ASSERT(qmobPriv(prototype->d.data)->revision >= 2);
        const auto *objects = prototype->d.relatedMetaObjects;
        if (objects) {
            while (*objects != nullptr) {
                addRelatedMetaObject(*objects);
                ++objects;
            }
        }
    }

    if ((members & StaticMetacall) != 0) {
        Q_ASSERT(qmobPriv(prototype->d.data)->revision >= 6);
        if (prototype->d.static_metacall)
            setStaticMetacallFunction(prototype->d.static_metacall);
    }
}